

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O3

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse4_2>::weight_from_sin
          (PolarExtentCoreSimd<xsimd::sse4_2> *this,PolarExtentCoreContext *ctx,batch sin_angle)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 in_EAX;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar14;
  float fVar15;
  float fVar21;
  ulong uVar16;
  float fVar20;
  float fVar22;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar23;
  undefined1 auVar19 [16];
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  batch bVar29;
  
  uVar16 = sin_angle.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data.
           _0_8_;
  fVar6 = ctx->sin_start_angle;
  fVar14 = sin_angle.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[0];
  fVar20 = sin_angle.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[1];
  auVar18._4_4_ = -(uint)(fVar6 < fVar20);
  auVar18._0_4_ = -(uint)(fVar6 < fVar14);
  auVar18._8_4_ = -(uint)(fVar6 < in_XMM0_Dc);
  auVar18._12_4_ = -(uint)(fVar6 < in_XMM0_Dd);
  iVar10 = movmskps(in_EAX,auVar18);
  if (iVar10 == 0) {
    uVar24 = 0x3f8000003f800000;
  }
  else {
    fVar7 = ctx->sin_end_angle;
    auVar27._4_4_ = -(uint)(fVar20 < fVar7);
    auVar27._0_4_ = -(uint)(fVar14 < fVar7);
    auVar27._8_4_ = -(uint)(in_XMM0_Dc < fVar7);
    auVar27._12_4_ = -(uint)(in_XMM0_Dd < fVar7);
    iVar10 = movmskps(iVar10,auVar27);
    if (iVar10 == 0) {
      uVar24 = 0;
    }
    else {
      fVar8 = ctx->m;
      fVar9 = ctx->c;
      auVar25._0_8_ = uVar16 & 0x7fffffff7fffffff;
      auVar25._8_4_ = ABS(in_XMM0_Dc);
      auVar25._12_4_ = ABS(in_XMM0_Dd);
      auVar26._0_4_ = ((float)DAT_0017b3c0 - ABS(fVar14)) * 0.5;
      auVar26._4_4_ = (DAT_0017b3c0._4_4_ - ABS(fVar20)) * 0.5;
      auVar26._8_4_ = (DAT_0017b3c0._8_4_ - auVar25._8_4_) * 0.5;
      auVar26._12_4_ = (DAT_0017b3c0._12_4_ - auVar25._12_4_) * 0.5;
      iVar10 = -(uint)(0.5 < ABS(fVar14));
      iVar11 = -(uint)(0.5 < ABS(fVar20));
      iVar12 = -(uint)(0.5 < auVar25._8_4_);
      iVar13 = -(uint)(0.5 < auVar25._12_4_);
      auVar17._0_4_ = fVar14 * fVar14;
      auVar17._4_4_ = fVar20 * fVar20;
      auVar17._8_4_ = in_XMM0_Dc * in_XMM0_Dc;
      auVar17._12_4_ = in_XMM0_Dd * in_XMM0_Dd;
      auVar1._4_4_ = iVar11;
      auVar1._0_4_ = iVar10;
      auVar1._8_4_ = iVar12;
      auVar1._12_4_ = iVar13;
      auVar18 = blendvps(auVar17,auVar26,auVar1);
      auVar27 = sqrtps(auVar26,auVar18);
      auVar2._4_4_ = iVar11;
      auVar2._0_4_ = iVar10;
      auVar2._8_4_ = iVar12;
      auVar2._12_4_ = iVar13;
      auVar27 = blendvps(auVar25,auVar27,auVar2);
      fVar15 = auVar18._0_4_;
      fVar21 = auVar18._4_4_;
      fVar22 = auVar18._8_4_;
      fVar23 = auVar18._12_4_;
      auVar19._0_4_ =
           fVar15 * auVar27._0_4_ *
           ((((fVar15 * 0.0421632 + 0.024181312) * fVar15 + 0.045470025) * fVar15 + 0.074953005) *
            fVar15 + 0.16666752) + auVar27._0_4_;
      auVar19._4_4_ =
           fVar21 * auVar27._4_4_ *
           ((((fVar21 * 0.0421632 + 0.024181312) * fVar21 + 0.045470025) * fVar21 + 0.074953005) *
            fVar21 + 0.16666752) + auVar27._4_4_;
      auVar19._8_4_ =
           fVar22 * auVar27._8_4_ *
           ((((fVar22 * 0.0421632 + 0.024181312) * fVar22 + 0.045470025) * fVar22 + 0.074953005) *
            fVar22 + 0.16666752) + auVar27._8_4_;
      auVar19._12_4_ =
           fVar23 * auVar27._12_4_ *
           ((((fVar23 * 0.0421632 + 0.024181312) * fVar23 + 0.045470025) * fVar23 + 0.074953005) *
            fVar23 + 0.16666752) + auVar27._12_4_;
      auVar28._0_4_ = 1.5707964 - (auVar19._0_4_ + auVar19._0_4_);
      auVar28._4_4_ = 1.5707964 - (auVar19._4_4_ + auVar19._4_4_);
      auVar28._8_4_ = 1.5707964 - (auVar19._8_4_ + auVar19._8_4_);
      auVar28._12_4_ = 1.5707964 - (auVar19._12_4_ + auVar19._12_4_);
      auVar3._4_4_ = iVar11;
      auVar3._0_4_ = iVar10;
      auVar3._8_4_ = iVar12;
      auVar3._12_4_ = iVar13;
      auVar18 = blendvps(auVar19,auVar28,auVar3);
      fVar15 = (float)(auVar18._0_4_ ^ (uint)fVar14 & 0x80000000) * fVar8;
      fVar21 = (float)(auVar18._4_4_ ^ (uint)fVar20 & 0x80000000) * fVar8;
      uVar16 = CONCAT44(fVar21,fVar15);
      auVar4._4_4_ = -(uint)(fVar6 < fVar20);
      auVar4._0_4_ = -(uint)(fVar6 < fVar14);
      auVar4._8_4_ = -(uint)(fVar6 < in_XMM0_Dc);
      auVar4._12_4_ = -(uint)(fVar6 < in_XMM0_Dd);
      auVar5._4_4_ = -(uint)(fVar20 < fVar7) & (uint)(fVar9 + fVar21);
      auVar5._0_4_ = -(uint)(fVar14 < fVar7) & (uint)(fVar9 + fVar15);
      auVar5._8_4_ = -(uint)(in_XMM0_Dc < fVar7) &
                     (uint)(fVar9 + (float)(auVar18._8_4_ ^ (uint)in_XMM0_Dc & 0x80000000) * fVar8);
      auVar5._12_4_ =
           -(uint)(in_XMM0_Dd < fVar7) &
           (uint)(fVar9 + (float)(auVar18._12_4_ ^ (uint)in_XMM0_Dd & 0x80000000) * fVar8);
      auVar18 = blendvps(_DAT_0017b3c0,auVar5,auVar4);
      uVar24 = auVar18._0_8_;
    }
  }
  bVar29.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)(int)uVar16;
  bVar29.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = (float)(int)(uVar16 >> 0x20);
  bVar29.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)(int)uVar24;
  bVar29.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)(int)((ulong)uVar24 >> 0x20);
  return (batch)bVar29.super_simd_register<float,_xsimd::sse4_2>.
                super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
  ;
}

Assistant:

batch weight_from_sin(PolarExtentCoreContext &ctx, batch sin_angle) const {
      auto start = sin_angle <= ctx.sin_start_angle;
      auto end = sin_angle >= ctx.sin_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::asin(sin_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }